

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::operator=
          (Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *this,
          Matrix<double,__1,__1,_0,__1,__1> *t)

{
  MutexError *anon_var_0;
  Matrix<double,__1,__1,_0,__1,__1> *t_local;
  Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *this_local;
  
  if ((((this->keepReference & 1U) == 0) || (this->signalType != REFERENCE_NON_CONST)) ||
     (this->TreferenceNonConst == (Matrix<double,__1,__1,_0,__1,__1> *)0x0)) {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this,t);
  }
  else if (this->providerMutex == (Mutex *)0x0) {
    setTcopy(this,t);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(this->TreferenceNonConst,t);
  }
  else {
    setTcopy(this,t);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(this->TreferenceNonConst,t);
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}